

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::WorldCoordinates::Decode(WorldCoordinates *this,KDataStream *stream)

{
  KException *this_00;
  KUINT16 KVar1;
  allocator<char> local_39;
  KString local_38;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x17 < KVar1) {
    KDataStream::Read<double>(stream,(double *)&this->m_f64X);
    KDataStream::Read<double>(stream,(double *)&this->m_f64Y);
    KDataStream::Read<double>(stream,(double *)&this->m_f64Z);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
  KException::KException(this_00,&local_38,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void WorldCoordinates::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < WORLD_COORDINATES_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_f64X
           >> m_f64Y
           >> m_f64Z;
}